

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TTSnapshot.cpp
# Opt level: O2

bool __thiscall TTD::SnapShot::AllWellKnownObjectsReusable(SnapShot *this,InflateMap *inflator)

{
  SnapObject *pSVar1;
  UnorderedArrayListLink *pUVar2;
  bool bVar3;
  UnorderedArrayListLink *pUVar4;
  RecyclableObject *obj;
  DynamicObject *dynObj;
  SnapObject *pSVar5;
  UnorderedArrayListLink **ppUVar6;
  SnapObject *snpObj;
  SnapObject *snpObject;
  
  pSVar5 = (this->m_compoundObjectList).m_inlineHeadBlock.CurrPos;
  pSVar1 = (this->m_compoundObjectList).m_inlineHeadBlock.BlockData;
  ppUVar6 = &(this->m_compoundObjectList).m_inlineHeadBlock.Next;
  snpObject = (SnapObject *)0x0;
  if (pSVar1 != pSVar5) {
    snpObject = pSVar1;
  }
  do {
    pUVar2 = *ppUVar6;
    do {
      do {
        pUVar4 = pUVar2;
        if (snpObject == (SnapObject *)0x0) {
LAB_00846e3b:
          return snpObject == (SnapObject *)0x0;
        }
        if (snpObject->OptWellKnownToken != (TTD_WELLKNOWN_TOKEN)0x0) {
          obj = InflateMap::FindReusableObject_WellKnowReuseCheck(inflator,snpObject->ObjectPtrId);
          dynObj = Js::VarTo<Js::DynamicObject,Js::RecyclableObject>(obj);
          bVar3 = NSSnapObjects::DoesObjectBlockScriptContextReuse(snpObject,dynObj,inflator);
          if (bVar3) goto LAB_00846e3b;
        }
        snpObject = snpObject + 1;
        pUVar2 = pUVar4;
      } while (snpObject != pSVar5);
      snpObject = (SnapObject *)0x0;
      pUVar2 = (UnorderedArrayListLink *)0x0;
    } while (pUVar4 == (UnorderedArrayListLink *)0x0);
    pSVar5 = pUVar4->CurrPos;
    snpObject = pUVar4->BlockData;
    ppUVar6 = &pUVar4->Next;
  } while( true );
}

Assistant:

bool SnapShot::AllWellKnownObjectsReusable(InflateMap* inflator) const
    {
        for(auto iter = this->m_compoundObjectList.GetIterator(); iter.IsValid(); iter.MoveNext())
        {
            const NSSnapObjects::SnapObject* snpObj = iter.Current();
            if(snpObj->OptWellKnownToken != TTD_INVALID_WELLKNOWN_TOKEN)
            {
                Js::RecyclableObject* rObj = inflator->FindReusableObject_WellKnowReuseCheck(snpObj->ObjectPtrId);
                bool blocking = NSSnapObjects::DoesObjectBlockScriptContextReuse(snpObj, Js::VarTo<Js::DynamicObject>(rObj), inflator);

                if(blocking)
                {
                    return false;
                }
            }
        }

        return true;
    }